

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void ClusterBlocksLiteral
               (MemoryManager *m,uint8_t *data,size_t length,size_t num_blocks,uint8_t *block_ids,
               BlockSplit *split)

{
  uint uVar1;
  uint *puVar2;
  void *__s;
  void *__s_00;
  HistogramLiteral *pHVar3;
  void *__s_01;
  size_t sVar4;
  uint32_t *puVar5;
  HistogramPair *pHVar6;
  HistogramLiteral *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_R8;
  long *in_R9;
  double dVar7;
  uint8_t id;
  uint8_t max_type;
  size_t block_idx_1;
  uint32_t cur_length;
  uint32_t *new_array_3;
  size_t _new_size_3;
  uint8_t *new_array_2;
  size_t _new_size_2;
  double cur_bits;
  double best_bits;
  uint32_t best_out;
  size_t j_1;
  uint32_t next_index;
  uint32_t *new_array_1;
  size_t _new_size_1;
  HistogramLiteral *new_array;
  size_t _new_size;
  size_t block_length;
  size_t k;
  size_t j;
  size_t num_new_clusters;
  size_t num_to_combine;
  size_t block_idx;
  HistogramLiteral *tmp;
  uint32_t *block_lengths;
  uint32_t *remap;
  uint32_t *symbols;
  uint32_t *new_clusters;
  uint32_t *sizes;
  size_t i;
  uint32_t *new_index;
  size_t num_final_clusters;
  uint32_t *clusters;
  size_t pos;
  HistogramPair *pairs;
  size_t pairs_capacity;
  size_t max_num_pairs;
  HistogramLiteral *histograms;
  size_t num_clusters;
  uint32_t *cluster_size;
  size_t cluster_size_capacity;
  size_t cluster_size_size;
  HistogramLiteral *all_histograms;
  size_t all_histograms_capacity;
  size_t all_histograms_size;
  size_t expected_num_clusters;
  uint32_t *u32;
  uint32_t *histogram_symbols;
  HistogramLiteral *in_stack_fffffffffffffcf8;
  HistogramLiteral *in_stack_fffffffffffffd00;
  HistogramLiteral *histogram;
  byte local_2d9;
  void *local_2d8;
  HistogramLiteral *local_2d0;
  void *local_2c8;
  HistogramLiteral *local_2c0;
  uint local_2b4;
  void *local_2b0;
  void *local_2a8;
  HistogramPair *in_stack_fffffffffffffd68;
  HistogramPair *pairs_00;
  uint32_t *in_stack_fffffffffffffd70;
  HistogramLiteral *in_stack_fffffffffffffd78;
  uint32_t *in_stack_fffffffffffffd80;
  HistogramLiteral *in_stack_fffffffffffffd88;
  HistogramLiteral *in_stack_fffffffffffffd90;
  void *local_260;
  HistogramLiteral *local_248;
  uint32_t *local_240;
  uint32_t *local_238;
  void *pvVar8;
  uint *puVar9;
  undefined6 in_stack_fffffffffffffde0;
  undefined1 in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  byte bVar10;
  size_t in_stack_fffffffffffffde8;
  long lVar11;
  int local_20c;
  HistogramLiteral *local_200;
  HistogramLiteral *local_1f0;
  double local_1e0;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  ulong local_1d0;
  int local_1c4;
  HistogramLiteral *local_1b8;
  HistogramLiteral *local_1a8;
  ulong local_198;
  HistogramLiteral *local_190;
  long local_178;
  HistogramLiteral *local_140;
  long local_120;
  HistogramLiteral *local_f8;
  uint32_t *local_f0;
  HistogramLiteral *local_e8;
  long local_e0;
  uint32_t *local_d8;
  HistogramLiteral *local_d0;
  long local_c8;
  
  if (in_RCX == (HistogramLiteral *)0x0) {
    puVar2 = (uint *)0x0;
  }
  else {
    puVar2 = (uint *)duckdb_brotli::BrotliAllocate
                               ((MemoryManager *)in_stack_fffffffffffffd00,
                                (size_t)in_stack_fffffffffffffcf8);
  }
  puVar9 = puVar2;
  if (in_RCX == (HistogramLiteral *)0xffffffffffffff00) {
    __s = (void *)0x0;
  }
  else {
    __s = duckdb_brotli::BrotliAllocate
                    ((MemoryManager *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
  }
  local_e8 = (HistogramLiteral *)((ulong)(((long)in_RCX->data_ + 0x3f) * 0x10) >> 6);
  local_c8 = 0;
  pvVar8 = __s;
  if (local_e8 == (HistogramLiteral *)0x0) {
    local_238 = (uint32_t *)0x0;
  }
  else {
    local_238 = (uint32_t *)
                duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)in_stack_fffffffffffffd00,
                           (size_t)in_stack_fffffffffffffcf8);
  }
  local_d8 = local_238;
  local_e0 = 0;
  if (local_e8 == (HistogramLiteral *)0x0) {
    local_240 = (uint32_t *)0x0;
  }
  else {
    local_240 = (uint32_t *)
                duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)in_stack_fffffffffffffd00,
                           (size_t)in_stack_fffffffffffffcf8);
  }
  local_f0 = local_240;
  local_f8 = (HistogramLiteral *)0x0;
  local_248 = in_RCX;
  if ((HistogramLiteral *)0x3f < in_RCX) {
    local_248 = (HistogramLiteral *)0x40;
  }
  if (local_248 == (HistogramLiteral *)0x0) {
    local_260 = (void *)0x0;
  }
  else {
    local_260 = duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)in_stack_fffffffffffffd00,
                           (size_t)in_stack_fffffffffffffcf8);
  }
  duckdb_brotli::BrotliAllocate
            ((MemoryManager *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
  local_120 = 0;
  __s_00 = duckdb_brotli::BrotliAllocate
                     ((MemoryManager *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
  memset(__s,0,((long)in_RCX->data_ + 0x100) * 4);
  local_178 = 0;
  for (local_140 = (HistogramLiteral *)0x0; local_140 < in_RDX;
      local_140 = (HistogramLiteral *)((long)local_140 + 1)) {
    *(int *)((long)__s + local_178 * 4 + 0x400) = *(int *)((long)__s + local_178 * 4 + 0x400) + 1;
    if (((long)local_140 + 1U == in_RDX) ||
       (*(char *)(in_R8 + (long)local_140) != *(char *)(in_R8 + 1 + (long)local_140))) {
      local_178 = local_178 + 1;
    }
  }
  local_d0 = local_e8;
  for (local_140 = (HistogramLiteral *)0x0; local_140 < in_RCX;
      local_140 = (HistogramLiteral *)((long)local_140->data_ + 0x40)) {
    pHVar3 = (HistogramLiteral *)((long)in_RCX - (long)local_140);
    if ((HistogramLiteral *)0x3f < pHVar3) {
      pHVar3 = (HistogramLiteral *)0x40;
    }
    in_stack_fffffffffffffd90 = pHVar3;
    for (local_190 = (HistogramLiteral *)0x0; local_190 < pHVar3;
        local_190 = (HistogramLiteral *)((long)local_190->data_ + 1)) {
      uVar1 = *(uint *)((long)__s + ((long)local_190->data_ + (long)local_140->data_) * 4 + 0x400);
      __s_01 = (void *)((long)local_260 + (long)local_190 * 0x410);
      memset(__s_01,0,0x400);
      *(undefined8 *)((long)__s_01 + 0x400) = 0;
      *(undefined8 *)((long)__s_01 + 0x408) = 0x7ff0000000000000;
      for (local_198 = 0; local_198 < uVar1; local_198 = local_198 + 1) {
        *(int *)((long)local_260 +
                (ulong)*(byte *)(in_RSI + local_120) * 4 + (long)local_190 * 0x410) =
             *(int *)((long)local_260 +
                     (ulong)*(byte *)(in_RSI + local_120) * 4 + (long)local_190 * 0x410) + 1;
        *(long *)((long)local_260 + (long)local_190 * 0x410 + 0x400) =
             *(long *)((long)local_260 + (long)local_190 * 0x410 + 0x400) + 1;
        local_120 = local_120 + 1;
      }
      dVar7 = duckdb_brotli::BrotliPopulationCostLiteral
                        ((HistogramLiteral *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      *(double *)((long)local_260 + (long)local_190 * 0x410 + 0x408) = dVar7;
      *(int *)((long)__s + (long)local_190 * 4 + 0x100) = (int)local_190;
      *(int *)((long)__s + (long)local_190 * 4 + 0x200) = (int)local_190;
      *(undefined4 *)((long)__s + (long)local_190 * 4) = 1;
    }
    in_stack_fffffffffffffcf8 = pHVar3;
    in_stack_fffffffffffffd00 = pHVar3;
    sVar4 = duckdb_brotli::BrotliHistogramCombineLiteral
                      (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80
                       ,in_stack_fffffffffffffd78->data_,in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd68,(size_t)pvVar8,(size_t)puVar9,
                       CONCAT17(in_stack_fffffffffffffde7,
                                CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
                       in_stack_fffffffffffffde8);
    if (local_d0 < (HistogramLiteral *)(local_c8 + sVar4)) {
      local_1a8 = local_d0;
      in_stack_fffffffffffffd88 = local_d0;
      if (local_d0 == (HistogramLiteral *)0x0) {
        local_1a8 = (HistogramLiteral *)(local_c8 + sVar4);
        in_stack_fffffffffffffd88 = local_1a8;
      }
      for (; local_1a8 < (HistogramLiteral *)(local_c8 + sVar4);
          local_1a8 = (HistogramLiteral *)((long)local_1a8 << 1)) {
      }
      if (local_1a8 == (HistogramLiteral *)0x0) {
        puVar5 = (uint32_t *)0x0;
      }
      else {
        puVar5 = (uint32_t *)
                 duckdb_brotli::BrotliAllocate
                           ((MemoryManager *)in_stack_fffffffffffffd00,
                            (size_t)in_stack_fffffffffffffcf8);
      }
      in_stack_fffffffffffffd80 = puVar5;
      if (local_d0 != (HistogramLiteral *)0x0) {
        memcpy(puVar5,local_d8,(long)local_d0 * 0x410);
      }
      duckdb_brotli::BrotliFree
                ((MemoryManager *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_d0 = local_1a8;
      local_d8 = puVar5;
    }
    if (local_e8 < (HistogramLiteral *)(local_e0 + sVar4)) {
      local_1b8 = local_e8;
      in_stack_fffffffffffffd78 = local_e8;
      if (local_e8 == (HistogramLiteral *)0x0) {
        local_1b8 = (HistogramLiteral *)(local_e0 + sVar4);
        in_stack_fffffffffffffd78 = local_1b8;
      }
      for (; local_1b8 < (HistogramLiteral *)(local_e0 + sVar4);
          local_1b8 = (HistogramLiteral *)((long)local_1b8 << 1)) {
      }
      if (local_1b8 == (HistogramLiteral *)0x0) {
        puVar5 = (uint32_t *)0x0;
      }
      else {
        puVar5 = (uint32_t *)
                 duckdb_brotli::BrotliAllocate
                           ((MemoryManager *)in_stack_fffffffffffffd00,
                            (size_t)in_stack_fffffffffffffcf8);
      }
      in_stack_fffffffffffffd70 = puVar5;
      if (local_e8 != (HistogramLiteral *)0x0) {
        memcpy(puVar5,local_f0,(long)local_e8 << 2);
      }
      duckdb_brotli::BrotliFree
                ((MemoryManager *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      local_e8 = local_1b8;
      local_f0 = puVar5;
    }
    for (local_190 = (HistogramLiteral *)0x0; local_190 < sVar4;
        local_190 = (HistogramLiteral *)((long)local_190 + 1)) {
      memcpy(local_d8 + local_c8 * 0x104,
             (void *)((long)local_260 +
                     (ulong)*(uint *)((long)__s + (long)local_190 * 4 + 0x100) * 0x410),0x410);
      local_f0[local_e0] =
           *(uint32_t *)((long)__s + (ulong)*(uint *)((long)__s + (long)local_190 * 4 + 0x100) * 4);
      *(int *)((long)__s + (ulong)*(uint *)((long)__s + (long)local_190 * 4 + 0x100) * 4 + 0x300) =
           (int)local_190;
      local_e0 = local_e0 + 1;
      local_c8 = local_c8 + 1;
    }
    for (local_190 = (HistogramLiteral *)0x0; local_190 < pHVar3;
        local_190 = (HistogramLiteral *)((long)local_190->data_ + 1)) {
      puVar2[(long)local_190->data_ + (long)local_140->data_] =
           (int)local_f8 +
           *(int *)((long)__s +
                   (ulong)*(uint *)((long)__s + (long)local_190 * 4 + 0x200) * 4 + 0x300);
    }
    local_f8 = (HistogramLiteral *)((long)local_f8->data_ + sVar4);
  }
  duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  pHVar6 = (HistogramPair *)(((ulong)local_f8 >> 1) * (long)local_f8);
  if ((HistogramPair *)((long)local_f8 << 6) < pHVar6) {
    pHVar6 = (HistogramPair *)((long)local_f8 << 6);
  }
  pairs_00 = pHVar6;
  if (((undefined1 *)0x801 < (undefined1 *)((long)&pHVar6->idx1 + 1U)) &&
     (duckdb_brotli::BrotliFree
                ((MemoryManager *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8),
     pHVar6 != (HistogramPair *)0xffffffffffffffff)) {
    duckdb_brotli::BrotliAllocate
              ((MemoryManager *)in_stack_fffffffffffffd00,(size_t)in_stack_fffffffffffffcf8);
  }
  if (local_f8 == (HistogramLiteral *)0x0) {
    local_2a8 = (void *)0x0;
  }
  else {
    local_2a8 = duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)in_stack_fffffffffffffd00,
                           (size_t)in_stack_fffffffffffffcf8);
  }
  for (local_140 = (HistogramLiteral *)0x0; local_140 < local_f8;
      local_140 = (HistogramLiteral *)((long)local_140->data_ + 1)) {
    *(int *)((long)local_2a8 + (long)local_140 * 4) = (int)local_140;
  }
  pHVar3 = local_f8;
  histogram = in_RCX;
  sVar4 = duckdb_brotli::BrotliHistogramCombineLiteral
                    (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                     in_stack_fffffffffffffd78->data_,in_stack_fffffffffffffd70,pairs_00,
                     (size_t)pvVar8,(size_t)puVar9,
                     CONCAT17(in_stack_fffffffffffffde7,
                              CONCAT16(in_stack_fffffffffffffde6,in_stack_fffffffffffffde0)),
                     in_stack_fffffffffffffde8);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  if (local_f8 == (HistogramLiteral *)0x0) {
    local_2b0 = (void *)0x0;
  }
  else {
    local_2b0 = duckdb_brotli::BrotliAllocate((MemoryManager *)histogram,(size_t)pHVar3);
  }
  for (local_140 = (HistogramLiteral *)0x0; local_140 < local_f8;
      local_140 = (HistogramLiteral *)((long)local_140->data_ + 1)) {
    *(undefined4 *)((long)local_2b0 + (long)local_140 * 4) = 0xffffffff;
  }
  local_120 = 0;
  local_1c4 = 0;
  for (local_140 = (HistogramLiteral *)0x0; local_140 < in_RCX;
      local_140 = (HistogramLiteral *)((long)local_140->data_ + 1)) {
    memset(__s_00,0,0x400);
    *(undefined8 *)((long)__s_00 + 0x400) = 0;
    *(undefined8 *)((long)__s_00 + 0x408) = 0x7ff0000000000000;
    for (local_1d0 = 0; local_1d0 < *(uint *)((long)__s + (long)local_140 * 4 + 0x400);
        local_1d0 = local_1d0 + 1) {
      *(int *)((long)__s_00 + (ulong)*(byte *)(in_RSI + local_120) * 4) =
           *(int *)((long)__s_00 + (ulong)*(byte *)(in_RSI + local_120) * 4) + 1;
      *(long *)((long)__s_00 + 0x400) = *(long *)((long)__s_00 + 0x400) + 1;
      local_120 = local_120 + 1;
    }
    if (local_140 == (HistogramLiteral *)0x0) {
      local_2b4 = *puVar2;
    }
    else {
      local_2b4 = puVar2[(long)((long)&local_140[-1].bit_cost_ + 7)];
    }
    local_1e0 = duckdb_brotli::BrotliHistogramBitCostDistanceLiteral
                          (histogram,pHVar3,(HistogramLiteral *)0x77f0a8);
    for (local_1d0 = 0; local_1d0 < sVar4; local_1d0 = local_1d0 + 1) {
      dVar7 = duckdb_brotli::BrotliHistogramBitCostDistanceLiteral
                        (histogram,pHVar3,(HistogramLiteral *)0x77f114);
      if (dVar7 < local_1e0) {
        local_2b4 = *(uint *)((long)local_2a8 + local_1d0 * 4);
        local_1e0 = dVar7;
      }
    }
    puVar2[(long)local_140] = local_2b4;
    if (*(int *)((long)local_2b0 + (ulong)local_2b4 * 4) == -1) {
      *(int *)((long)local_2b0 + (ulong)local_2b4 * 4) = local_1c4;
      local_1c4 = local_1c4 + 1;
    }
  }
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  if ((HistogramLiteral *)in_R9[4] < in_RCX) {
    local_2c0 = in_RCX;
    if (in_R9[4] != 0) {
      local_2c0 = (HistogramLiteral *)in_R9[4];
    }
    for (local_1f0 = local_2c0; local_1f0 < in_RCX;
        local_1f0 = (HistogramLiteral *)((long)local_1f0 << 1)) {
    }
    if (local_1f0 == (HistogramLiteral *)0x0) {
      local_2c8 = (void *)0x0;
    }
    else {
      local_2c8 = duckdb_brotli::BrotliAllocate((MemoryManager *)histogram,(size_t)pHVar3);
    }
    if (in_R9[4] != 0) {
      memcpy(local_2c8,(void *)in_R9[2],in_R9[4]);
    }
    duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
    in_R9[2] = 0;
    in_R9[2] = (long)local_2c8;
    in_R9[4] = (long)local_1f0;
  }
  if ((HistogramLiteral *)in_R9[5] < in_RCX) {
    local_2d0 = in_RCX;
    if (in_R9[5] != 0) {
      local_2d0 = (HistogramLiteral *)in_R9[5];
    }
    for (local_200 = local_2d0; local_200 < in_RCX;
        local_200 = (HistogramLiteral *)((long)local_200 << 1)) {
    }
    if (local_200 == (HistogramLiteral *)0x0) {
      local_2d8 = (void *)0x0;
    }
    else {
      local_2d8 = duckdb_brotli::BrotliAllocate((MemoryManager *)histogram,(size_t)pHVar3);
    }
    if (in_R9[5] != 0) {
      memcpy(local_2d8,(void *)in_R9[3],in_R9[5] << 2);
    }
    duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
    in_R9[3] = 0;
    in_R9[3] = (long)local_2d8;
    in_R9[5] = (long)local_200;
  }
  local_20c = 0;
  lVar11 = 0;
  bVar10 = 0;
  for (local_140 = (HistogramLiteral *)0x0; local_140 < in_RCX;
      local_140 = (HistogramLiteral *)((long)local_140->data_ + 1)) {
    local_20c = *(int *)((long)__s + (long)local_140 * 4 + 0x400) + local_20c;
    if (((HistogramLiteral *)((long)local_140->data_ + 1U) == in_RCX) ||
       (local_2d9 = bVar10, puVar2[(long)local_140] != puVar2[(long)((long)local_140->data_ + 1)]))
    {
      local_2d9 = (byte)*(undefined4 *)((long)local_2b0 + (ulong)puVar2[(long)local_140] * 4);
      *(byte *)(in_R9[2] + lVar11) = local_2d9;
      *(int *)(in_R9[3] + lVar11 * 4) = local_20c;
      if (local_2d9 < bVar10) {
        local_2d9 = bVar10;
      }
      local_20c = 0;
      lVar11 = lVar11 + 1;
    }
    bVar10 = local_2d9;
  }
  in_R9[1] = lVar11;
  *in_R9 = (ulong)bVar10 + 1;
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  duckdb_brotli::BrotliFree((MemoryManager *)histogram,pHVar3);
  return;
}

Assistant:

static void FN(ClusterBlocks)(MemoryManager* m,
                              const DataType* data, const size_t length,
                              const size_t num_blocks,
                              uint8_t* block_ids,
                              BlockSplit* split) {
  uint32_t* histogram_symbols = BROTLI_ALLOC(m, uint32_t, num_blocks);
  uint32_t* u32 =
      BROTLI_ALLOC(m, uint32_t, num_blocks + 4 * HISTOGRAMS_PER_BATCH);
  const size_t expected_num_clusters = CLUSTERS_PER_BATCH *
      (num_blocks + HISTOGRAMS_PER_BATCH - 1) / HISTOGRAMS_PER_BATCH;
  size_t all_histograms_size = 0;
  size_t all_histograms_capacity = expected_num_clusters;
  HistogramType* all_histograms =
      BROTLI_ALLOC(m, HistogramType, all_histograms_capacity);
  size_t cluster_size_size = 0;
  size_t cluster_size_capacity = expected_num_clusters;
  uint32_t* cluster_size = BROTLI_ALLOC(m, uint32_t, cluster_size_capacity);
  size_t num_clusters = 0;
  HistogramType* histograms = BROTLI_ALLOC(m, HistogramType,
      BROTLI_MIN(size_t, num_blocks, HISTOGRAMS_PER_BATCH));
  size_t max_num_pairs =
      HISTOGRAMS_PER_BATCH * HISTOGRAMS_PER_BATCH / 2;
  size_t pairs_capacity = max_num_pairs + 1;
  HistogramPair* pairs = BROTLI_ALLOC(m, HistogramPair, pairs_capacity);
  size_t pos = 0;
  uint32_t* clusters;
  size_t num_final_clusters;
  static const uint32_t kInvalidIndex = BROTLI_UINT32_MAX;
  uint32_t* new_index;
  size_t i;
  uint32_t* BROTLI_RESTRICT const sizes = u32 + 0 * HISTOGRAMS_PER_BATCH;
  uint32_t* BROTLI_RESTRICT const new_clusters = u32 + 1 * HISTOGRAMS_PER_BATCH;
  uint32_t* BROTLI_RESTRICT const symbols = u32 + 2 * HISTOGRAMS_PER_BATCH;
  uint32_t* BROTLI_RESTRICT const remap = u32 + 3 * HISTOGRAMS_PER_BATCH;
  uint32_t* BROTLI_RESTRICT const block_lengths =
      u32 + 4 * HISTOGRAMS_PER_BATCH;
  /* TODO(eustas): move to arena? */
  HistogramType* tmp = BROTLI_ALLOC(m, HistogramType, 2);

  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histogram_symbols) ||
      BROTLI_IS_NULL(u32) || BROTLI_IS_NULL(all_histograms) ||
      BROTLI_IS_NULL(cluster_size) || BROTLI_IS_NULL(histograms) ||
      BROTLI_IS_NULL(pairs) || BROTLI_IS_NULL(tmp)) {
    return;
  }

  memset(u32, 0, (num_blocks + 4 * HISTOGRAMS_PER_BATCH) * sizeof(uint32_t));

  /* Calculate block lengths (convert repeating values -> series length). */
  {
    size_t block_idx = 0;
    for (i = 0; i < length; ++i) {
      BROTLI_DCHECK(block_idx < num_blocks);
      ++block_lengths[block_idx];
      if (i + 1 == length || block_ids[i] != block_ids[i + 1]) {
        ++block_idx;
      }
    }
    BROTLI_DCHECK(block_idx == num_blocks);
  }

  /* Pre-cluster blocks (cluster batches). */
  for (i = 0; i < num_blocks; i += HISTOGRAMS_PER_BATCH) {
    const size_t num_to_combine =
        BROTLI_MIN(size_t, num_blocks - i, HISTOGRAMS_PER_BATCH);
    size_t num_new_clusters;
    size_t j;
    for (j = 0; j < num_to_combine; ++j) {
      size_t k;
      size_t block_length = block_lengths[i + j];
      FN(HistogramClear)(&histograms[j]);
      for (k = 0; k < block_length; ++k) {
        FN(HistogramAdd)(&histograms[j], data[pos++]);
      }
      histograms[j].bit_cost_ = FN(BrotliPopulationCost)(&histograms[j]);
      new_clusters[j] = (uint32_t)j;
      symbols[j] = (uint32_t)j;
      sizes[j] = 1;
    }
    num_new_clusters = FN(BrotliHistogramCombine)(
        histograms, tmp, sizes, symbols, new_clusters, pairs, num_to_combine,
        num_to_combine, HISTOGRAMS_PER_BATCH, max_num_pairs);
    BROTLI_ENSURE_CAPACITY(m, HistogramType, all_histograms,
        all_histograms_capacity, all_histograms_size + num_new_clusters);
    BROTLI_ENSURE_CAPACITY(m, uint32_t, cluster_size,
        cluster_size_capacity, cluster_size_size + num_new_clusters);
    if (BROTLI_IS_OOM(m)) return;
    for (j = 0; j < num_new_clusters; ++j) {
      all_histograms[all_histograms_size++] = histograms[new_clusters[j]];
      cluster_size[cluster_size_size++] = sizes[new_clusters[j]];
      remap[new_clusters[j]] = (uint32_t)j;
    }
    for (j = 0; j < num_to_combine; ++j) {
      histogram_symbols[i + j] = (uint32_t)num_clusters + remap[symbols[j]];
    }
    num_clusters += num_new_clusters;
    BROTLI_DCHECK(num_clusters == cluster_size_size);
    BROTLI_DCHECK(num_clusters == all_histograms_size);
  }
  BROTLI_FREE(m, histograms);

  /* Final clustering. */
  max_num_pairs =
      BROTLI_MIN(size_t, 64 * num_clusters, (num_clusters / 2) * num_clusters);
  if (pairs_capacity < max_num_pairs + 1) {
    BROTLI_FREE(m, pairs);
    pairs = BROTLI_ALLOC(m, HistogramPair, max_num_pairs + 1);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(pairs)) return;
  }
  clusters = BROTLI_ALLOC(m, uint32_t, num_clusters);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(clusters)) return;
  for (i = 0; i < num_clusters; ++i) {
    clusters[i] = (uint32_t)i;
  }
  num_final_clusters = FN(BrotliHistogramCombine)(
      all_histograms, tmp, cluster_size, histogram_symbols, clusters, pairs,
      num_clusters, num_blocks, BROTLI_MAX_NUMBER_OF_BLOCK_TYPES,
      max_num_pairs);
  BROTLI_FREE(m, pairs);
  BROTLI_FREE(m, cluster_size);

  /* Assign blocks to final histograms. */
  new_index = BROTLI_ALLOC(m, uint32_t, num_clusters);
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(new_index)) return;
  for (i = 0; i < num_clusters; ++i) new_index[i] = kInvalidIndex;
  pos = 0;
  {
    uint32_t next_index = 0;
    for (i = 0; i < num_blocks; ++i) {
      size_t j;
      uint32_t best_out;
      double best_bits;
      FN(HistogramClear)(tmp);
      for (j = 0; j < block_lengths[i]; ++j) {
        FN(HistogramAdd)(tmp, data[pos++]);
      }
      /* Among equally good histograms prefer last used. */
      /* TODO(eustas): should we give a block-switch discount here? */
      best_out = (i == 0) ? histogram_symbols[0] : histogram_symbols[i - 1];
      best_bits = FN(BrotliHistogramBitCostDistance)(
          tmp, &all_histograms[best_out], tmp + 1);
      for (j = 0; j < num_final_clusters; ++j) {
        const double cur_bits = FN(BrotliHistogramBitCostDistance)(
            tmp, &all_histograms[clusters[j]], tmp + 1);
        if (cur_bits < best_bits) {
          best_bits = cur_bits;
          best_out = clusters[j];
        }
      }
      histogram_symbols[i] = best_out;
      if (new_index[best_out] == kInvalidIndex) {
        new_index[best_out] = next_index++;
      }
    }
  }
  BROTLI_FREE(m, tmp);
  BROTLI_FREE(m, clusters);
  BROTLI_FREE(m, all_histograms);
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, split->types, split->types_alloc_size, num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, split->lengths, split->lengths_alloc_size, num_blocks);
  if (BROTLI_IS_OOM(m)) return;

  /* Rewrite final assignment to block-split. There might be less blocks
   * than |num_blocks| due to clustering. */
  {
    uint32_t cur_length = 0;
    size_t block_idx = 0;
    uint8_t max_type = 0;
    for (i = 0; i < num_blocks; ++i) {
      cur_length += block_lengths[i];
      if (i + 1 == num_blocks ||
          histogram_symbols[i] != histogram_symbols[i + 1]) {
        const uint8_t id = (uint8_t)new_index[histogram_symbols[i]];
        split->types[block_idx] = id;
        split->lengths[block_idx] = cur_length;
        max_type = BROTLI_MAX(uint8_t, max_type, id);
        cur_length = 0;
        ++block_idx;
      }
    }
    split->num_blocks = block_idx;
    split->num_types = (size_t)max_type + 1;
  }
  BROTLI_FREE(m, new_index);
  BROTLI_FREE(m, u32);
  BROTLI_FREE(m, histogram_symbols);
}